

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

string * cmSystemTools::EscapeQuotes(string *__return_storage_ptr__,string *str)

{
  char *local_38;
  char *ch;
  string *str_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_38 = (char *)std::__cxx11::string::c_str(); *local_38 != '\0'; local_38 = local_38 + 1)
  {
    if (*local_38 == '\"') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\\');
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmSystemTools::EscapeQuotes(const std::string& str)
{
  std::string result;
  result.reserve(str.size());
  for (const char* ch = str.c_str(); *ch != '\0'; ++ch) {
    if (*ch == '"') {
      result += '\\';
    }
    result += *ch;
  }
  return result;
}